

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

string * __thiscall pbrt::Quaternion::ToString_abi_cxx11_(Quaternion *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string Quaternion::ToString() const {
    return StringPrintf("[ %f, %f, %f, %f ]", v.x, v.y, v.z, w);
}